

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O2

void appendBasicRowsToBasis(HighsLp *lp,HighsBasis *highs_basis,HighsInt XnumNewRow)

{
  pointer pHVar1;
  long lVar2;
  size_type __new_size;
  
  if (highs_basis->valid == false) {
    puts("\n!!Appending columns to invalid basis!!\n");
  }
  if (XnumNewRow != 0) {
    __new_size = (long)XnumNewRow + (long)lp->num_row_;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&highs_basis->row_status,__new_size);
    pHVar1 = (highs_basis->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar2 = (long)lp->num_row_; lVar2 < (long)__new_size; lVar2 = lVar2 + 1) {
      pHVar1[lVar2] = kBasic;
    }
  }
  return;
}

Assistant:

void appendBasicRowsToBasis(HighsLp& lp, HighsBasis& highs_basis,
                            HighsInt XnumNewRow) {
  assert(highs_basis.valid);
  if (!highs_basis.valid) {
    printf("\n!!Appending columns to invalid basis!!\n\n");
  }
  // Add basic logicals
  if (XnumNewRow == 0) return;
  HighsInt newNumRow = lp.num_row_ + XnumNewRow;
  highs_basis.row_status.resize(newNumRow);
  // Make the new rows basic
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
    highs_basis.row_status[iRow] = HighsBasisStatus::kBasic;
  }
}